

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed_size_allocator.cpp
# Opt level: O2

FixedSizeAllocatorInfo * __thiscall
duckdb::FixedSizeAllocator::GetInfo
          (FixedSizeAllocatorInfo *__return_storage_ptr__,FixedSizeAllocator *this)

{
  _Prime_rehash_policy *this_00;
  vector<unsigned_long,_true> *this_01;
  FixedSizeAllocatorInfo *pFVar1;
  pointer pFVar2;
  InternalException *this_02;
  __node_base *p_Var3;
  __node_base *p_Var4;
  allocator local_69;
  FixedSizeAllocatorInfo *local_68;
  _Hash_node_base *local_60;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_58;
  string local_50;
  
  local_58 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             &__return_storage_ptr__->buffer_ids;
  (__return_storage_ptr__->buffers_with_free_space).
  super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (__return_storage_ptr__->buffers_with_free_space).
  super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (__return_storage_ptr__->allocation_sizes).
  super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (__return_storage_ptr__->allocation_sizes).
  super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->segment_counts).
  super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->allocation_sizes).
  super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (__return_storage_ptr__->segment_counts).
  super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (__return_storage_ptr__->segment_counts).
  super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (__return_storage_ptr__->block_pointers).
  super_vector<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>.
  super__Vector_base<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->block_pointers).
  super_vector<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>.
  super__Vector_base<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->buffer_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->block_pointers).
  super_vector<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>.
  super__Vector_base<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->buffer_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (__return_storage_ptr__->buffer_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (__return_storage_ptr__->buffers_with_free_space).
  super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  __return_storage_ptr__->segment_size = this->segment_size;
  p_Var4 = &(this->buffers)._M_h._M_before_begin;
  local_60 = (_Hash_node_base *)0x7ffffffffff080;
  local_68 = __return_storage_ptr__;
  while( true ) {
    pFVar1 = local_68;
    p_Var4 = p_Var4->_M_nxt;
    if (p_Var4 == (__node_base *)0x0) {
      p_Var3 = &(this->buffers_with_free_space)._M_h._M_before_begin;
      this_01 = &local_68->buffers_with_free_space;
      while (p_Var3 = p_Var3->_M_nxt, p_Var3 != (__node_base *)0x0) {
        ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_01,
                   (value_type_conflict2 *)(p_Var3 + 1));
      }
      return pFVar1;
    }
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              (local_58,(value_type_conflict2 *)(p_Var4 + 1));
    if (local_60 < p_Var4[1]._M_nxt) break;
    this_00 = (_Prime_rehash_policy *)(p_Var4 + 2);
    pFVar2 = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
             ::operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                           *)this_00);
    ::std::vector<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>::push_back
              (&(__return_storage_ptr__->block_pointers).
                super_vector<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>,
               &pFVar2->block_pointer);
    pFVar2 = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
             ::operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                           *)this_00);
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               &__return_storage_ptr__->segment_counts,&pFVar2->segment_count);
    pFVar2 = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
             ::operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                           *)this_00);
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               &__return_storage_ptr__->allocation_sizes,&pFVar2->allocation_size);
  }
  this_02 = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_50,"Initializing invalid buffer ID in FixedSizeAllocator::GetInfo",
             &local_69);
  InternalException::InternalException(this_02,&local_50);
  __cxa_throw(this_02,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

FixedSizeAllocatorInfo FixedSizeAllocator::GetInfo() const {
	FixedSizeAllocatorInfo info;
	info.segment_size = segment_size;

	for (const auto &buffer : buffers) {
		info.buffer_ids.push_back(buffer.first);

		// Memory safety check.
		if (buffer.first > idx_t(MAX_ROW_ID)) {
			throw InternalException("Initializing invalid buffer ID in FixedSizeAllocator::GetInfo");
		}

		info.block_pointers.push_back(buffer.second->block_pointer);
		info.segment_counts.push_back(buffer.second->segment_count);
		info.allocation_sizes.push_back(buffer.second->allocation_size);
	}

	for (auto &buffer_id : buffers_with_free_space) {
		info.buffers_with_free_space.push_back(buffer_id);
	}

	return info;
}